

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O2

size_t read_line(int socket,dino_string_ptr *string_buffer_ptr)

{
  void *__buf;
  char cVar1;
  ulong in_RAX;
  dino_string_ptr pdVar2;
  ssize_t sVar3;
  size_t sVar4;
  undefined8 uStack_38;
  char c;
  
  if (string_buffer_ptr != (dino_string_ptr *)0x0) {
    uStack_38 = in_RAX;
    if (*string_buffer_ptr == (dino_string_ptr)0x0) {
      pdVar2 = dino_string_new();
      *string_buffer_ptr = pdVar2;
    }
    else {
      dino_string_reset(*string_buffer_ptr);
    }
    __buf = (void *)((long)&uStack_38 + 7);
    uStack_38 = uStack_38 & 0xffffffffffffff;
    cVar1 = '\0';
    while (cVar1 != '\n') {
      sVar3 = recv(socket,__buf,1,0);
      if (sVar3 < 1) {
        uStack_38 = CONCAT17(10,(undefined7)uStack_38);
        cVar1 = '\n';
      }
      else {
        cVar1 = uStack_38._7_1_;
        if (uStack_38._7_1_ == '\r') {
          sVar3 = recv(socket,__buf,1,2);
          if ((sVar3 < 1) || (uStack_38._7_1_ != '\n')) {
            uStack_38 = CONCAT17(10,(undefined7)uStack_38);
            cVar1 = '\n';
          }
          else {
            recv(socket,__buf,1,0);
            cVar1 = uStack_38._7_1_;
          }
        }
        dino_string_append_char(*string_buffer_ptr,cVar1);
        cVar1 = uStack_38._7_1_;
      }
    }
    sVar4 = dino_string_c_strlen(*string_buffer_ptr);
    return sVar4;
  }
  return 0;
}

Assistant:

size_t read_line(int socket, dino_string_ptr *string_buffer_ptr) {

    // If input is invalid then just error out.
    //
    if (NULL == string_buffer_ptr) {
        return 0;
    }

    // We are getting a new "line" so wack the old one if it exists.
    //
    if (*string_buffer_ptr) {
        dino_string_reset(*string_buffer_ptr);
    } else {
        *string_buffer_ptr = dino_string_new();
    }

    // Now we read in the data:
    //
    char c = '\0';

    while (c != '\n') {
        ssize_t n = recv(socket, &c, 1, 0);

        if (n > 0) {
            if (c == '\r') {
                n = recv(socket, &c, 1, MSG_PEEK);

                if ((n > 0) && (c == '\n')) {
                    recv(socket, &c, 1, 0);
                } else {
                    c = '\n';
                }
            }

            dino_string_append_char(*string_buffer_ptr, c);
        } else {
            c = '\n';
        }
    }

    return dino_string_c_strlen(*string_buffer_ptr);
}